

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
checkOptionValue(HighsLogOptions *report_log_options,OptionRecordString *option,string *value)

{
  __type _Var1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  __lhs = in_RDX;
  _Var1 = std::operator==(unaff_retaddr,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (_Var1) {
    bVar2 = commandLineOffChooseOnOk(report_log_options,(string *)option,value);
    if ((!bVar2) && (bVar2 = std::operator!=(__lhs,(char *)in_RDX), bVar2)) {
      return kIllegalValue;
    }
  }
  else {
    _Var1 = std::operator==(unaff_retaddr,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (_Var1) {
      bVar2 = commandLineSolverOk(report_log_options,(string *)option);
      if (!bVar2) {
        return kIllegalValue;
      }
    }
    else {
      _Var1 = std::operator==(unaff_retaddr,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (_Var1) {
        bVar2 = commandLineOffChooseOnOk(report_log_options,(string *)option,value);
        if (!bVar2) {
          return kIllegalValue;
        }
      }
      else {
        _Var1 = std::operator==(unaff_retaddr,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (_Var1) {
          bVar2 = commandLineOffChooseOnOk(report_log_options,(string *)option,value);
          if (!bVar2) {
            return kIllegalValue;
          }
        }
        else {
          _Var1 = std::operator==(unaff_retaddr,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          if ((_Var1) &&
             (bVar2 = commandLineOffOnOk((HighsLogOptions *)value,unaff_retaddr,
                                         (string *)
                                         CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8)), !bVar2)) {
            return kIllegalValue;
          }
        }
      }
    }
  }
  return kOk;
}

Assistant:

OptionStatus checkOptionValue(const HighsLogOptions& report_log_options,
                              OptionRecordString& option,
                              const std::string value) {
  // Setting a string option. For some options only particular values
  // are permitted, so check them
  if (option.name == kPresolveString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value) &&
        value != "mip")
      return OptionStatus::kIllegalValue;
  } else if (option.name == kSolverString) {
    if (!commandLineSolverOk(report_log_options, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kParallelString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kRunCrossoverString) {
    if (!commandLineOffChooseOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  } else if (option.name == kRangingString) {
    if (!commandLineOffOnOk(report_log_options, option.name, value))
      return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}